

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_MonsterFallingDamage(AActor *mo)

{
  TAngle<double> local_30;
  FName local_24;
  double local_20;
  double vel;
  AActor *pAStack_10;
  int damage;
  AActor *mo_local;
  
  if (((level.flags2 & 0x100) != 0) && ((mo->floorsector->Flags & 2) == 0)) {
    local_20 = ABS((mo->Vel).Z);
    vel._4_4_ = 1000000;
    pAStack_10 = mo;
    FName::FName(&local_24,NAME_Falling);
    TAngle<double>::TAngle(&local_30,0.0);
    P_DamageMobj(mo,(AActor *)0x0,(AActor *)0x0,1000000,&local_24,0,&local_30);
  }
  return;
}

Assistant:

void P_MonsterFallingDamage (AActor *mo)
{
	int damage;
	double vel;

	if (!(level.flags2 & LEVEL2_MONSTERFALLINGDAMAGE))
		return;
	if (mo->floorsector->Flags & SECF_NOFALLINGDAMAGE)
		return;

	vel = fabs(mo->Vel.Z);
	if (vel > 35)
	{ // automatic death
		damage = TELEFRAG_DAMAGE;
	}
	else
	{
		damage = int((vel - 23)*6);
	}
	damage = TELEFRAG_DAMAGE;	// always kill 'em
	P_DamageMobj (mo, NULL, NULL, damage, NAME_Falling);
}